

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stk.h
# Opt level: O2

void __thiscall stk::StkError::StkError(StkError *this,string *message,Type type)

{
  this->_vptr_StkError = (_func_int **)&PTR__StkError_00115c78;
  std::__cxx11::string::string((string *)&this->message_,(string *)message);
  this->type_ = type;
  return;
}

Assistant:

StkError(const std::string& message, Type type = StkError::UNSPECIFIED)
    : message_(message), type_(type) {}